

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O2

lzma_index * index_init_plain(lzma_allocator *allocator)

{
  lzma_index *plVar1;
  
  plVar1 = (lzma_index *)lzma_alloc(0x50,allocator);
  if (plVar1 != (lzma_index *)0x0) {
    *(undefined8 *)((long)&(plVar1->streams).leftmost + 4) = 0;
    *(undefined8 *)((long)&(plVar1->streams).rightmost + 4) = 0;
    (plVar1->streams).root = (index_tree_node *)0x0;
    (plVar1->streams).leftmost = (index_tree_node *)0x0;
    plVar1->uncompressed_size = 0;
    plVar1->total_size = 0;
    plVar1->record_count = 0;
    plVar1->index_list_size = 0;
    plVar1->prealloc = 0x200;
    plVar1->checks = 0;
  }
  return plVar1;
}

Assistant:

static lzma_index *
index_init_plain(const lzma_allocator *allocator)
{
	lzma_index *i = lzma_alloc(sizeof(lzma_index), allocator);
	if (i != NULL) {
		index_tree_init(&i->streams);
		i->uncompressed_size = 0;
		i->total_size = 0;
		i->record_count = 0;
		i->index_list_size = 0;
		i->prealloc = INDEX_GROUP_SIZE;
		i->checks = 0;
	}

	return i;
}